

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase_locale.cpp
# Opt level: O2

int32_t ustrcase_getCaseLocale_63(char *locale)

{
  int32_t iVar1;
  
  if (locale == (char *)0x0) {
    locale = uloc_getDefault_63();
  }
  if (*locale != '\0') {
    iVar1 = ucase_getCaseLocale_63(locale);
    return iVar1;
  }
  return 1;
}

Assistant:

U_CFUNC int32_t
ustrcase_getCaseLocale(const char *locale) {
    if (locale == NULL) {
        locale = uloc_getDefault();
    }
    if (*locale == 0) {
        return UCASE_LOC_ROOT;
    } else {
        return ucase_getCaseLocale(locale);
    }
}